

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::PLOCAL_INC(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *a,SQObjectPtr *incr)

{
  bool bVar1;
  undefined1 local_48 [8];
  SQObjectPtr trg;
  SQObjectPtr *incr_local;
  SQObjectPtr *a_local;
  SQObjectPtr *target_local;
  SQInteger op_local;
  SQVM *this_local;
  
  trg.super_SQObject._unVal = (SQObjectValue)incr;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
  bVar1 = ARITH_OP(this,op,(SQObjectPtr *)local_48,a,(SQObjectPtr *)trg.super_SQObject._unVal.pTable
                  );
  if (bVar1) {
    ::SQObjectPtr::operator=(target,a);
    ::SQObjectPtr::operator=(a,(SQObjectPtr *)local_48);
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
  return bVar1;
}

Assistant:

bool SQVM::PLOCAL_INC(SQInteger op,SQObjectPtr &target, SQObjectPtr &a, SQObjectPtr &incr)
{
    SQObjectPtr trg;
    _RET_ON_FAIL(ARITH_OP( op , trg, a, incr));
    target = a;
    a = trg;
    return true;
}